

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_mem.c
# Opt level: O2

int zt_mem_page_destroy(zt_mem_page *page)

{
  zt_mem_pool *pzVar1;
  size_t sVar2;
  ulong uVar3;
  zt_mem_page *pzVar4;
  zt_elist *pzVar5;
  undefined1 auVar6 [16];
  long lVar7;
  long lVar8;
  int extraout_EAX;
  int iVar9;
  int extraout_EAX_00;
  zt_mem_page *pzVar10;
  ulong uVar11;
  
  pzVar1 = page->parent_pool;
  if (page->num_free_elts < pzVar1->elts_per_page) {
    iVar9 = printf("error: %s called when elements are still in use!\n","zt_mem_page_destroy");
    return iVar9;
  }
  lVar7 = pzVar1->nfree_pages - 1;
  lVar8 = pzVar1->npages - 1;
  auVar6._8_4_ = (int)lVar8;
  auVar6._0_8_ = lVar7;
  auVar6._12_4_ = (int)((ulong)lVar8 >> 0x20);
  pzVar1->nfree_pages = lVar7;
  pzVar1->npages = auVar6._8_8_;
  sVar2 = pzVar1->elt_size;
  pzVar10 = page + 1;
  uVar3 = page->num_free_elts;
  for (uVar11 = 0; uVar11 < uVar3; uVar11 = uVar11 + 1) {
    pzVar4 = (zt_mem_page *)(pzVar10->page_list).next;
    if (pzVar4 != pzVar10) {
      pzVar5 = (pzVar10->page_list).prev;
      (pzVar4->page_list).prev = pzVar5;
      pzVar5->next = (zt_elist *)pzVar4;
    }
    pzVar10 = (zt_mem_page *)((long)&pzVar10->num_free_elts + sVar2);
  }
  pzVar10 = (zt_mem_page *)(page->page_list).next;
  if (pzVar10 != page) {
    pzVar5 = (page->page_list).prev;
    (pzVar10->page_list).prev = pzVar5;
    pzVar5->next = (zt_elist *)pzVar10;
    free(page);
    return extraout_EAX_00;
  }
  free(page);
  return extraout_EAX;
}

Assistant:

static int
zt_mem_page_destroy(zt_mem_page *page)
{
    zt_mem_elt * elt;
    unsigned long i;
    size_t       size;

    if (page->num_free_elts < page->parent_pool->elts_per_page) {
        printf("error: %s called when elements are still in use!\n", ZT_LOG_FUNCTION);
        return 1;
    }

    page->parent_pool->npages--;
    page->parent_pool->nfree_pages--;

    size = sizeof(zt_mem_elt) + page->parent_pool->elt_size;
    elt = (zt_mem_elt *)page->data;
    /* remove the elements from the free element list */
    for (i = 0; i < page->num_free_elts; i++) {
        if (zt_elist_empty(&elt->free_elt_list) == 0) {
            zt_elist_remove(&elt->free_elt_list);
        }
        elt = (zt_mem_elt *)((unsigned long)elt + size);
    }
    /* remove the page from the page list */
    if (zt_elist_empty(&page->page_list) == 0) {
        zt_elist_remove(&page->page_list);
    }
    GLOBAL_zmt.dealloc(page);
    return 0;
}